

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderCommonFunctionTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::SignCase::getInputValues(SignCase *this,int numValues,void **values)

{
  bool bVar1;
  deUint32 dVar2;
  int minValue;
  int maxValue;
  char *str;
  const_reference pvVar3;
  vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  *this_00;
  float minValue_00;
  float maxValue_00;
  int local_9c [3];
  float local_90;
  float local_8c;
  float local_88 [5];
  int local_74;
  Precision local_70;
  int scalarSize;
  Precision precision;
  DataType type;
  Random rnd;
  IVec2 intRanges [3];
  Vector<float,_2> local_38;
  Vec2 floatRanges [3];
  void **values_local;
  int numValues_local;
  SignCase *this_local;
  
  floatRanges[2].m_data = (float  [2])values;
  tcu::Vector<float,_2>::Vector(&local_38,-2.0,2.0);
  tcu::Vector<float,_2>::Vector(floatRanges,-10000.0,10000.0);
  tcu::Vector<float,_2>::Vector(floatRanges + 1,-1e+08,1e+08);
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&rnd.m_rnd.z,-0x80,0x7f);
  tcu::Vector<int,_2>::Vector(intRanges,-0x8000,0x7fff);
  tcu::Vector<int,_2>::Vector(intRanges + 1,-0x80000000,0x7fffffff);
  str = tcu::TestNode::getName((TestNode *)this);
  dVar2 = deStringHash(str);
  de::Random::Random((Random *)&precision,dVar2 ^ 0x324);
  this_00 = &(this->super_CommonFunctionCase).m_spec.inputs;
  pvVar3 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](this_00,0);
  scalarSize = glu::VarType::getBasicType(&pvVar3->varType);
  pvVar3 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](this_00,0);
  local_70 = glu::VarType::getPrecision(&pvVar3->varType);
  local_74 = glu::getDataTypeScalarSize(scalarSize);
  bVar1 = glu::isDataTypeFloatOrVec(scalarSize);
  if (bVar1) {
    local_88[0] = 1.0;
    std::fill<float*,float>
              (*(float **)floatRanges[2].m_data,*(float **)floatRanges[2].m_data + local_74,local_88
              );
    local_8c = -1.0;
    std::fill<float*,float>
              ((float *)(*(long *)floatRanges[2].m_data + (long)local_74 * 4),
               (float *)(*(long *)floatRanges[2].m_data + (long)(local_74 * 2) * 4),&local_8c);
    local_90 = 0.0;
    std::fill<float*,float>
              ((float *)(*(long *)floatRanges[2].m_data + (long)(local_74 * 2) * 4),
               (float *)(*(long *)floatRanges[2].m_data + (long)(local_74 * 3) * 4),&local_90);
    minValue_00 = tcu::Vector<float,_2>::x(floatRanges + ((ulong)local_70 - 1));
    maxValue_00 = tcu::Vector<float,_2>::y(floatRanges + ((ulong)local_70 - 1));
    fillRandomScalars<float>
              ((Random *)&precision,minValue_00,maxValue_00,
               (void *)(*(long *)floatRanges[2].m_data + (long)(local_74 * 3) * 4),
               (numValues + -3) * local_74,0);
  }
  else {
    local_9c[2] = 1;
    std::fill<int*,int>(*(int **)floatRanges[2].m_data,*(int **)floatRanges[2].m_data + local_74,
                        local_9c + 2);
    local_9c[1] = 0xffffffff;
    std::fill<int*,int>((int *)(*(long *)floatRanges[2].m_data + (long)local_74 * 4),
                        (int *)(*(long *)floatRanges[2].m_data + (long)(local_74 * 2) * 4),
                        local_9c + 1);
    local_9c[0] = 0;
    std::fill<int*,int>((int *)(*(long *)floatRanges[2].m_data + (long)(local_74 * 2) * 4),
                        (int *)(*(long *)floatRanges[2].m_data + (long)(local_74 * 3) * 4),local_9c)
    ;
    minValue = tcu::Vector<int,_2>::x(intRanges + ((ulong)local_70 - 1));
    maxValue = tcu::Vector<int,_2>::y(intRanges + ((ulong)local_70 - 1));
    fillRandomScalars<int>
              ((Random *)&precision,minValue,maxValue,
               (void *)(*(long *)floatRanges[2].m_data + (long)(local_74 * 3) * 4),
               (numValues + -3) * local_74,0);
  }
  de::Random::~Random((Random *)&precision);
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		const Vec2 floatRanges[] =
		{
			Vec2(-2.0f,		2.0f),	// lowp
			Vec2(-1e4f,		1e4f),	// mediump	- note: may end up as inf
			Vec2(-1e8f,		1e8f)	// highp	- note: may end up as inf
		};
		const IVec2 intRanges[] =
		{
			IVec2(-(1<<7),		(1<<7)-1),
			IVec2(-(1<<15),		(1<<15)-1),
			IVec2(0x80000000,	0x7fffffff)
		};

		de::Random				rnd			(deStringHash(getName()) ^ 0x324u);
		const glu::DataType		type		= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision	= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize	= glu::getDataTypeScalarSize(type);

		if (glu::isDataTypeFloatOrVec(type))
		{
			// Special cases.
			std::fill((float*)values[0],				(float*)values[0] + scalarSize,		+1.0f);
			std::fill((float*)values[0] + scalarSize*1,	(float*)values[0] + scalarSize*2,	-1.0f);
			std::fill((float*)values[0] + scalarSize*2,	(float*)values[0] + scalarSize*3,	0.0f);
			fillRandomScalars(rnd, floatRanges[precision].x(), floatRanges[precision].y(), (float*)values[0] + scalarSize*3, (numValues-3)*scalarSize);
		}
		else
		{
			std::fill((int*)values[0],					(int*)values[0] + scalarSize,		+1);
			std::fill((int*)values[0] + scalarSize*1,	(int*)values[0] + scalarSize*2,		-1);
			std::fill((int*)values[0] + scalarSize*2,	(int*)values[0] + scalarSize*3,		0);
			fillRandomScalars(rnd, intRanges[precision].x(), intRanges[precision].y(), (int*)values[0] + scalarSize*3, (numValues-3)*scalarSize);
		}
	}